

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fctstr_safe_cpy(char *dst,char *src,size_t num)

{
  if (dst == (char *)0x0) {
    __assert_fail("dst != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x105
                  ,"void fctstr_safe_cpy(char *, const char *, size_t)");
  }
  if (src != (char *)0x0) {
    if (num != 0) {
      strncpy(dst,src,num);
      dst[num - 1] = '\0';
      return;
    }
    __assert_fail("num > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x107
                  ,"void fctstr_safe_cpy(char *, const char *, size_t)");
  }
  __assert_fail("src != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x106,
                "void fctstr_safe_cpy(char *, const char *, size_t)");
}

Assistant:

static void
fctstr_safe_cpy(char *dst, char const *src, size_t num)
{
    FCT_ASSERT( dst != NULL );
    FCT_ASSERT( src != NULL );
    FCT_ASSERT( num > 0 );
#if defined(WIN32) && _MSC_VER >= 1400
    strncpy_s(dst, num, src, _TRUNCATE);
#else
    strncpy(dst, src, num);
#endif
    dst[num-1] = '\0';
}